

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O3

BBox * __thiscall CMU462::DynamicScene::Mesh::get_bbox(BBox *__return_storage_ptr__,Mesh *this)

{
  _List_node_base *p_Var1;
  
  (__return_storage_ptr__->max).x = -INFINITY;
  (__return_storage_ptr__->max).y = -INFINITY;
  (__return_storage_ptr__->max).z = -INFINITY;
  (__return_storage_ptr__->min).x = INFINITY;
  (__return_storage_ptr__->min).y = INFINITY;
  (__return_storage_ptr__->min).z = INFINITY;
  (__return_storage_ptr__->extent).x = -INFINITY;
  (__return_storage_ptr__->extent).y = -INFINITY;
  (__return_storage_ptr__->extent).z = -INFINITY;
  for (p_Var1 = (this->mesh).vertices.
                super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl._M_node.
                super__List_node_base._M_next; p_Var1 != (_List_node_base *)&(this->mesh).vertices;
      p_Var1 = p_Var1->_M_next) {
    BBox::expand(__return_storage_ptr__,(Vector3D *)&p_Var1[1]._M_prev);
  }
  return __return_storage_ptr__;
}

Assistant:

BBox Mesh::get_bbox() {
  BBox bbox;
  for (VertexIter it = mesh.verticesBegin(); it != mesh.verticesEnd(); it++) {
    bbox.expand(it->position);
  }
  return bbox;
}